

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O2

int compression_code_copy(archive *a,la_zstream *lastrm,la_zaction action)

{
  ulong uVar1;
  ulong __n;
  
  uVar1 = lastrm->avail_in;
  __n = lastrm->avail_out;
  if (uVar1 <= lastrm->avail_out) {
    __n = uVar1;
  }
  if (__n != 0) {
    memcpy(lastrm->next_out,lastrm->next_in,__n);
    lastrm->next_in = lastrm->next_in + __n;
    uVar1 = lastrm->avail_in - __n;
    lastrm->avail_in = uVar1;
    lastrm->total_in = lastrm->total_in + __n;
    lastrm->next_out = lastrm->next_out + __n;
    lastrm->avail_out = lastrm->avail_out - __n;
    lastrm->total_out = lastrm->total_out + __n;
  }
  return (int)(uVar1 == 0 && action == ARCHIVE_Z_FINISH);
}

Assistant:

static int
compression_code_copy(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	size_t bytes;

	(void)a; /* UNUSED */
	if (lastrm->avail_out > lastrm->avail_in)
		bytes = lastrm->avail_in;
	else
		bytes = lastrm->avail_out;
	if (bytes) {
		memcpy(lastrm->next_out, lastrm->next_in, bytes);
		lastrm->next_in += bytes;
		lastrm->avail_in -= bytes;
		lastrm->total_in += bytes;
		lastrm->next_out += bytes;
		lastrm->avail_out -= bytes;
		lastrm->total_out += bytes;
	}
	if (action == ARCHIVE_Z_FINISH && lastrm->avail_in == 0)
		return (ARCHIVE_EOF);
	return (ARCHIVE_OK);
}